

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O0

int __thiscall QLocalSocketPrivate::init(QLocalSocketPrivate *this,EVP_PKEY_CTX *ctx)

{
  QLocalSocket *pQVar1;
  QLocalUnixSocket *pQVar2;
  long in_FS_OFFSET;
  QLocalSocket *q;
  QObject local_40 [8];
  QObject local_38 [8];
  QObject local_30 [8];
  QObject local_28 [8];
  QObject local_20 [8];
  QObject local_18 [8];
  QObject local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(this);
  pQVar2 = &this->unixSocket;
  QObject::connect(local_10,(char *)pQVar2,(QObject *)"2bytesWritten(qint64)",(char *)pQVar1,
                   0x3d92d4);
  QMetaObject::Connection::~Connection((Connection *)local_10);
  QObject::connect(local_18,(char *)pQVar2,(QObject *)"2readyRead()",(char *)pQVar1,0x3c0138);
  QMetaObject::Connection::~Connection((Connection *)local_18);
  QObject::connect(local_20,(char *)pQVar2,(QObject *)"2connected()",(char *)pQVar1,0x3d9268);
  QMetaObject::Connection::~Connection((Connection *)local_20);
  QObject::connect(local_28,(char *)pQVar2,(QObject *)"2disconnected()",(char *)pQVar1,0x3d928c);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  QObject::connect(local_30,(char *)pQVar2,(QObject *)"2stateChanged(QAbstractSocket::SocketState)",
                   (char *)pQVar1,0x3ea6c0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  QObject::connect(local_38,(char *)pQVar2,(QObject *)"2errorOccurred(QAbstractSocket::SocketError)"
                   ,(char *)pQVar1,0x3ea6ef);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QObject::connect(local_40,(char *)pQVar2,(QObject *)"2readChannelFinished()",(char *)pQVar1,
                   0x3c4591);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::setParent((QObject *)pQVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QLocalSocketPrivate::init()
{
    Q_Q(QLocalSocket);
    // QIODevice signals
    q->connect(&unixSocket, SIGNAL(bytesWritten(qint64)),
               q, SIGNAL(bytesWritten(qint64)));
    q->connect(&unixSocket, SIGNAL(readyRead()), q, SIGNAL(readyRead()));
    // QAbstractSocket signals
    q->connect(&unixSocket, SIGNAL(connected()), q, SIGNAL(connected()));
    q->connect(&unixSocket, SIGNAL(disconnected()), q, SIGNAL(disconnected()));
    q->connect(&unixSocket, SIGNAL(stateChanged(QAbstractSocket::SocketState)),
               q, SLOT(_q_stateChanged(QAbstractSocket::SocketState)));
    q->connect(&unixSocket, SIGNAL(errorOccurred(QAbstractSocket::SocketError)),
               q, SLOT(_q_errorOccurred(QAbstractSocket::SocketError)));
    q->connect(&unixSocket, SIGNAL(readChannelFinished()), q, SIGNAL(readChannelFinished()));
    unixSocket.setParent(q);
}